

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_s128_128_640(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  mzd_local_t *pmVar1;
  undefined1 auVar2 [64];
  uint w;
  int iVar3;
  uint i;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  word128 cval [5];
  
  iVar3 = 2;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  cval[4] = auVar2._48_16_;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  cval[0][0] = auVar2._0_8_;
  cval[0][1] = auVar2._8_8_;
  cval[1][0] = auVar2._16_8_;
  cval[1][1] = auVar2._24_8_;
  cval[2][0] = auVar2._32_8_;
  cval[2][1] = auVar2._40_8_;
  cval[3][0] = auVar2._48_8_;
  cval[3][1] = auVar2._56_8_;
  do {
    iVar4 = 0x40;
    do {
      auVar6 = vpbroadcastq_avx512vl();
      lVar5 = 0;
      do {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar5),auVar6,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar5),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar5) = auVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x20);
      lVar5 = 0x20;
      do {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar5),auVar6,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar5),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar5) = auVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      pmVar1 = A + 2;
      A = A + 3;
      iVar4 = iVar4 + -1;
      cval[4] = (word128)vpternlogq_avx512vl(auVar6,*(undefined1 (*) [16])pmVar1->w64,
                                             (undefined1  [16])cval[4],0x6a);
    } while (iVar4 != 0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  c->w64[0] = cval[0][0];
  c->w64[1] = cval[0][1];
  c->w64[2] = cval[1][0];
  c->w64[3] = cval[1][1];
  c[1].w64[0] = cval[2][0];
  c[1].w64[1] = cval[2][1];
  c[1].w64[2] = cval[3][0];
  c[1].w64[3] = cval[3][1];
  *(word128 *)c[2].w64 = cval[4];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_128_640(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[5] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 3) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      cval[4] = mm128_xor_mask(cval[4], mm128_load(Ablock[2].w64), mask);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
}